

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

leb_DiamondParent leb_DecodeDiamondParent(leb_Node node)

{
  uint uVar1;
  leb_SameDepthNeighborIDs lVar2;
  leb_DiamondParent lVar3;
  
  if (node.id != node.depth) {
    node = (leb_Node)
           (((ulong)node & 0xffffffff00000000) - 0x100000000 | (ulong)node >> 1 & 0x7fffffff);
  }
  lVar2 = leb_DecodeSameDepthNeighborIDs(node);
  uVar1 = lVar2.edge;
  if (uVar1 == 0) {
    uVar1 = node.id;
  }
  lVar3.top = (leb_Node)((ulong)uVar1 | (ulong)node & 0xffffffff00000000);
  lVar3.base = node;
  return lVar3;
}

Assistant:

LEBDEF leb_DiamondParent leb_DecodeDiamondParent(const leb_Node node)
{
    leb_Node parentNode = leb_ParentNode(node);
    uint32_t diamondNodeID = leb_DecodeSameDepthNeighborIDs(parentNode).edge;
    leb_Node diamondNode = {
        diamondNodeID > 0u ? diamondNodeID : parentNode.id,
        parentNode.depth
    };

    return {parentNode, diamondNode};
}